

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalNinjaGenerator::OpenFileStream
          (cmGlobalNinjaGenerator *this,
          unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *stream,
          string *name)

{
  cmGeneratedFileStream *pcVar1;
  size_t sVar2;
  int iVar3;
  string *psVar4;
  bool bVar5;
  string path;
  undefined1 local_a1;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  bVar5 = true;
  if ((stream->_M_t).
      super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t
      .super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
      super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl ==
      (cmGeneratedFileStream *)0x0) {
    psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    local_80.View_._M_str = (psVar4->_M_dataplus)._M_p;
    local_80.View_._M_len = psVar4->_M_string_length;
    local_50.View_._M_str = local_50.Digits_;
    local_50.View_._M_len = 1;
    local_50.Digits_[0] = '/';
    cmStrCat<std::__cxx11::string>(&local_a0,&local_80,&local_50,name);
    local_a1 = None;
    iVar3 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [5])(this);
    local_50.View_._M_len = CONCAT44(local_50.View_._M_len._4_4_,iVar3);
    std::make_unique<cmGeneratedFileStream,std::__cxx11::string&,bool,codecvt::Encoding>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
               (bool *)&local_a0,(Encoding *)&local_a1);
    sVar2 = local_80.View_._M_len;
    local_80.View_._M_len = 0;
    pcVar1 = (stream->_M_t).
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    (stream->_M_t).
    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
    super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
         (cmGeneratedFileStream *)sVar2;
    if (pcVar1 != (cmGeneratedFileStream *)0x0) {
      (**(code **)(*(long *)&(pcVar1->super_ofstream).
                             super_basic_ostream<char,_std::char_traits<char>_> + 8))();
      if ((long *)local_80.View_._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_80.View_._M_len + 8))();
      }
    }
    pcVar1 = (stream->_M_t).
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    if (((&(pcVar1->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)(pcVar1->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                _vptr_basic_ostream[0xfffffffffffffffd]] & 5) == 0) {
      WriteDisclaimer(this,(ostream *)pcVar1);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      std::__cxx11::string::~string((string *)&local_a0);
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenFileStream(
  std::unique_ptr<cmGeneratedFileStream>& stream, const std::string& name)
{
  // Get a stream where to generate things.
  if (!stream) {
    // Compute Ninja's build file path.
    std::string path =
      cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(), '/', name);
    stream = cm::make_unique<cmGeneratedFileStream>(
      path, false, this->GetMakefileEncoding());
    if (!(*stream)) {
      // An error message is generated by the constructor if it cannot
      // open the file.
      return false;
    }

    // Write the do not edit header.
    this->WriteDisclaimer(*stream);
  }

  return true;
}